

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_reference.cpp
# Opt level: O1

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundReferenceExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,Vector *result)

{
  reference other;
  
  other = vector<duckdb::Vector,_true>::operator[](&this->chunk->data,expr->index);
  if (sel != (SelectionVector *)0x0) {
    Vector::Slice(result,other,sel,count);
    return;
  }
  Vector::Reference(result,other);
  return;
}

Assistant:

void ExpressionExecutor::Execute(const BoundReferenceExpression &expr, ExpressionState *state,
                                 const SelectionVector *sel, idx_t count, Vector &result) {
	D_ASSERT(expr.index != DConstants::INVALID_INDEX);
	D_ASSERT(expr.index < chunk->ColumnCount());

	if (sel) {
		result.Slice(chunk->data[expr.index], *sel, count);
	} else {
		result.Reference(chunk->data[expr.index]);
	}
}